

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

void polygon_web_init(Am_Slot *slot,Am_Web_Init *init)

{
  Am_Object_Advanced AVar1;
  Am_Object_Advanced local_80;
  Am_Object_Advanced local_78;
  Am_Object_Advanced local_70;
  Am_Object_Advanced local_68;
  Am_Object_Advanced local_60;
  Am_Object_Advanced local_58;
  Am_Object_Advanced local_50;
  Am_Object_Advanced local_48;
  Am_Object_Advanced local_40 [3];
  Am_Object_Advanced local_28;
  Am_Slot local_20;
  Am_Object_Advanced obj;
  Am_Web_Init *init_local;
  Am_Slot *slot_local;
  
  obj.super_Am_Object.data = (Am_Object)(Am_Object)init;
  Am_Slot::Get_Owner(&local_20);
  AVar1.super_Am_Object.data = obj.super_Am_Object.data;
  Am_Object_Advanced::Am_Object_Advanced(&local_28,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Input((Am_Web_Init *)AVar1.super_Am_Object.data,&local_28,0xb2);
  Am_Object_Advanced::~Am_Object_Advanced(&local_28);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(local_40,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Input((Am_Web_Init *)AVar1.super_Am_Object.data,local_40,100);
  Am_Object_Advanced::~Am_Object_Advanced(local_40);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_48,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Input((Am_Web_Init *)AVar1.super_Am_Object.data,&local_48,0x65);
  Am_Object_Advanced::~Am_Object_Advanced(&local_48);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_50,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Input((Am_Web_Init *)AVar1.super_Am_Object.data,&local_50,0x66);
  Am_Object_Advanced::~Am_Object_Advanced(&local_50);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_58,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Input((Am_Web_Init *)AVar1.super_Am_Object.data,&local_58,0x67);
  Am_Object_Advanced::~Am_Object_Advanced(&local_58);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_60,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Input((Am_Web_Init *)AVar1.super_Am_Object.data,&local_60,0x6b);
  Am_Object_Advanced::~Am_Object_Advanced(&local_60);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_68,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Output((Am_Web_Init *)AVar1.super_Am_Object.data,&local_68,0xb2);
  Am_Object_Advanced::~Am_Object_Advanced(&local_68);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_70,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Output((Am_Web_Init *)AVar1.super_Am_Object.data,&local_70,0x65);
  Am_Object_Advanced::~Am_Object_Advanced(&local_70);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_78,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Output((Am_Web_Init *)AVar1.super_Am_Object.data,&local_78,0x66);
  Am_Object_Advanced::~Am_Object_Advanced(&local_78);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_80,(Am_Object_Advanced *)&local_20);
  Am_Web_Init::Note_Output((Am_Web_Init *)AVar1.super_Am_Object.data,&local_80,0x67);
  Am_Object_Advanced::~Am_Object_Advanced(&local_80);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_20);
  return;
}

Assistant:

static void
polygon_web_init(const Am_Slot &slot, Am_Web_Init &init)
{
  Am_Object_Advanced obj = slot.Get_Owner();
  init.Note_Input(obj, Am_POINT_LIST);
  init.Note_Input(obj, Am_LEFT);
  init.Note_Input(obj, Am_TOP);
  init.Note_Input(obj, Am_WIDTH);
  init.Note_Input(obj, Am_HEIGHT);
  init.Note_Input(obj, Am_LINE_STYLE);
  init.Note_Output(obj, Am_POINT_LIST);
  init.Note_Output(obj, Am_TOP);
  init.Note_Output(obj, Am_WIDTH);
  init.Note_Output(obj, Am_HEIGHT);
}